

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O2

void __thiscall pgn::strip(pgn *this,string *token)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  string *__range1;
  size_type sVar4;
  string result;
  string skip;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"!?+#[]\"{}",(allocator<char> *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  pcVar1 = (token->_M_dataplus)._M_p;
  sVar2 = token->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (&local_50,pcVar1[sVar4],0);
    if (sVar3 == 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&local_70,pcVar1[sVar4]);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (token,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

inline void pgn::strip(std::string& token) {
	std::string skip = "!?+#[]\"{}";
	std::string result = "";
	for (const auto& c : token) {
		if (skip.find(c) != std::string::npos) { continue; }
		else result += c;
	}
	token = result;
}